

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  bool bVar1;
  ImDrawIdx IVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  ImFontGlyph *pIVar6;
  ImDrawCmd *pIVar7;
  char *local_100;
  char *local_f0;
  float local_d0;
  float local_cc;
  float v2;
  float u2;
  float v1;
  float u1;
  float y2;
  float y1;
  float x2;
  float x1;
  ImFontGlyph *glyph;
  float char_width;
  uint c;
  char c_1;
  ImDrawIdx *pIStack_98;
  uint vtx_current_idx;
  ImDrawIdx *idx_write;
  ImDrawVert *vtx_write;
  int idx_expected_size;
  int idx_count_max;
  int vtx_count_max;
  float y_end;
  char *s_end;
  char *s;
  char *word_wrap_eol;
  float local_58;
  float fStack_54;
  bool word_wrap_enabled;
  float line_height;
  float scale;
  float y;
  float x;
  bool cpu_fine_clip_local;
  char *pcStack_40;
  float wrap_width_local;
  char *text_end_local;
  char *text_begin_local;
  ImVec4 *clip_rect_local;
  ImU32 col_local;
  float size_local;
  ImDrawList *draw_list_local;
  ImFont *this_local;
  ImVec2 pos_local;
  
  y._3_1_ = cpu_fine_clip;
  x = wrap_width;
  pcStack_40 = text_end;
  text_end_local = text_begin;
  text_begin_local = (char *)clip_rect;
  clip_rect_local._0_4_ = col;
  clip_rect_local._4_4_ = size;
  _col_local = draw_list;
  draw_list_local = (ImDrawList *)this;
  this_local = (ImFont *)pos;
  if (text_end == (char *)0x0) {
    sVar4 = strlen(text_begin);
    pcStack_40 = text_begin + sVar4;
  }
  scale = (float)(int)this_local._0_4_ + (this->DisplayOffset).x;
  line_height = (float)(int)this_local._4_4_ + (this->DisplayOffset).y;
  this_local = (ImFont *)CONCAT44(line_height,scale);
  if (line_height < *(float *)(text_begin_local + 0xc) ||
      line_height == *(float *)(text_begin_local + 0xc)) {
    fStack_54 = clip_rect_local._4_4_ / this->FontSize;
    local_58 = this->FontSize * fStack_54;
    word_wrap_eol._7_1_ = 0.0 < x;
    s = (char *)0x0;
    s_end = text_end_local;
    if ((line_height + local_58 < *(float *)(text_begin_local + 4)) && (!(bool)word_wrap_eol._7_1_))
    {
      for (; line_height + local_58 < *(float *)(text_begin_local + 4) && s_end < pcStack_40;
          line_height = local_58 + line_height) {
        pvVar5 = memchr(s_end,10,(long)pcStack_40 - (long)s_end);
        if (pvVar5 == (void *)0x0) {
          local_f0 = pcStack_40;
        }
        else {
          local_f0 = (char *)((long)pvVar5 + 1);
        }
        s_end = local_f0;
      }
    }
    if ((10000 < (long)pcStack_40 - (long)s_end) && ((word_wrap_eol._7_1_ & 1) == 0)) {
      _vtx_count_max = s_end;
      for (idx_count_max = (int)line_height;
          (float)idx_count_max < *(float *)(text_begin_local + 0xc) && _vtx_count_max < pcStack_40;
          idx_count_max = (int)(local_58 + (float)idx_count_max)) {
        pvVar5 = memchr(_vtx_count_max,10,(long)pcStack_40 - (long)_vtx_count_max);
        if (pvVar5 == (void *)0x0) {
          local_100 = pcStack_40;
        }
        else {
          local_100 = (char *)((long)pvVar5 + 1);
        }
        _vtx_count_max = local_100;
      }
      pcStack_40 = _vtx_count_max;
    }
    if (s_end != pcStack_40) {
      idx_expected_size = ((int)pcStack_40 - (int)s_end) * 4;
      vtx_write._4_4_ = ((int)pcStack_40 - (int)s_end) * 6;
      vtx_write._0_4_ = (_col_local->IdxBuffer).Size + vtx_write._4_4_;
      ImDrawList::PrimReserve(_col_local,vtx_write._4_4_,idx_expected_size);
      idx_write = (ImDrawIdx *)_col_local->_VtxWritePtr;
      pIStack_98 = _col_local->_IdxWritePtr;
      c = _col_local->_VtxCurrentIdx;
LAB_003452dd:
      do {
        if (pcStack_40 <= s_end) break;
        if ((word_wrap_eol._7_1_ & 1) != 0) {
          if (s == (char *)0x0) {
            s = CalcWordWrapPositionA
                          (this,fStack_54,s_end,pcStack_40,x - (scale - this_local._0_4_));
            if (s == s_end) {
              s = s + 1;
            }
          }
          if (s <= s_end) {
            scale = this_local._0_4_;
            line_height = local_58 + line_height;
            s = (char *)0x0;
            for (; s_end < pcStack_40; s_end = s_end + 1) {
              char_width._3_1_ = *s_end;
              bVar1 = ImCharIsBlankA(char_width._3_1_);
              if (!bVar1) {
                if (char_width._3_1_ == '\n') {
                  s_end = s_end + 1;
                }
                break;
              }
            }
            goto LAB_003452dd;
          }
        }
        glyph._4_4_ = (uint)*s_end;
        if (glyph._4_4_ < 0x80) {
          s_end = s_end + 1;
        }
        else {
          iVar3 = ImTextCharFromUtf8((uint *)((long)&glyph + 4),s_end,pcStack_40);
          s_end = s_end + iVar3;
          if (glyph._4_4_ == 0) break;
        }
        if (0x1f < glyph._4_4_) {
LAB_00345479:
          glyph._0_4_ = 0.0;
          pIVar6 = FindGlyph(this,(ImWchar)glyph._4_4_);
          if (((pIVar6 != (ImFontGlyph *)0x0) &&
              (glyph._0_4_ = pIVar6->AdvanceX * fStack_54, glyph._4_4_ != 0x20)) &&
             (glyph._4_4_ != 9)) {
            y1 = pIVar6->X0 * fStack_54 + scale;
            y2 = pIVar6->X1 * fStack_54 + scale;
            u1 = pIVar6->Y0 * fStack_54 + line_height;
            v1 = pIVar6->Y1 * fStack_54 + line_height;
            if ((y1 <= *(float *)(text_begin_local + 8)) && (*(float *)text_begin_local <= y2)) {
              u2 = pIVar6->U0;
              v2 = pIVar6->V0;
              local_cc = pIVar6->U1;
              local_d0 = pIVar6->V1;
              if ((y._3_1_ & 1) != 0) {
                if (y1 < *(float *)text_begin_local) {
                  u2 = (1.0 - (y2 - *(float *)text_begin_local) / (y2 - y1)) * (local_cc - u2) + u2;
                  y1 = *(float *)text_begin_local;
                }
                if (u1 < *(float *)(text_begin_local + 4)) {
                  v2 = (1.0 - (v1 - *(float *)(text_begin_local + 4)) / (v1 - u1)) * (local_d0 - v2)
                       + v2;
                  u1 = *(float *)(text_begin_local + 4);
                }
                if (*(float *)(text_begin_local + 8) <= y2 && y2 != *(float *)(text_begin_local + 8)
                   ) {
                  local_cc = ((*(float *)(text_begin_local + 8) - y1) / (y2 - y1)) * (local_cc - u2)
                             + u2;
                  y2 = *(float *)(text_begin_local + 8);
                }
                if (*(float *)(text_begin_local + 0xc) <= v1 &&
                    v1 != *(float *)(text_begin_local + 0xc)) {
                  local_d0 = ((*(float *)(text_begin_local + 0xc) - u1) / (v1 - u1)) *
                             (local_d0 - v2) + v2;
                  v1 = *(float *)(text_begin_local + 0xc);
                }
                if (v1 <= u1) {
                  scale = glyph._0_4_ + scale;
                  goto LAB_003452dd;
                }
              }
              IVar2 = (ImDrawIdx)c;
              *pIStack_98 = IVar2;
              pIStack_98[1] = IVar2 + 1;
              pIStack_98[2] = IVar2 + 2;
              pIStack_98[3] = IVar2;
              pIStack_98[4] = IVar2 + 2;
              pIStack_98[5] = IVar2 + 3;
              *(float *)idx_write = y1;
              *(float *)(idx_write + 2) = u1;
              *(ImU32 *)(idx_write + 8) = (ImU32)clip_rect_local;
              *(float *)(idx_write + 4) = u2;
              *(float *)(idx_write + 6) = v2;
              *(float *)(idx_write + 10) = y2;
              *(float *)(idx_write + 0xc) = u1;
              *(ImU32 *)(idx_write + 0x12) = (ImU32)clip_rect_local;
              *(float *)(idx_write + 0xe) = local_cc;
              *(float *)(idx_write + 0x10) = v2;
              *(float *)(idx_write + 0x14) = y2;
              *(float *)(idx_write + 0x16) = v1;
              *(ImU32 *)(idx_write + 0x1c) = (ImU32)clip_rect_local;
              *(float *)(idx_write + 0x18) = local_cc;
              *(float *)(idx_write + 0x1a) = local_d0;
              *(float *)(idx_write + 0x1e) = y1;
              *(float *)(idx_write + 0x20) = v1;
              *(ImU32 *)(idx_write + 0x26) = (ImU32)clip_rect_local;
              *(float *)(idx_write + 0x22) = u2;
              *(float *)(idx_write + 0x24) = local_d0;
              idx_write = idx_write + 0x28;
              c = c + 4;
              pIStack_98 = pIStack_98 + 6;
            }
          }
          scale = glyph._0_4_ + scale;
          goto LAB_003452dd;
        }
        if (glyph._4_4_ != 10) {
          if (glyph._4_4_ != 0xd) goto LAB_00345479;
          goto LAB_003452dd;
        }
        scale = this_local._0_4_;
        line_height = local_58 + line_height;
      } while (line_height < *(float *)(text_begin_local + 0xc) ||
               line_height == *(float *)(text_begin_local + 0xc));
      ImVector<ImDrawVert>::resize
                (&_col_local->VtxBuffer,
                 (int)(((long)idx_write - (long)(_col_local->VtxBuffer).Data) / 0x14));
      ImVector<unsigned_short>::resize
                (&_col_local->IdxBuffer,
                 (int)((long)pIStack_98 - (long)(_col_local->IdxBuffer).Data >> 1));
      iVar3 = (int)vtx_write - (_col_local->IdxBuffer).Size;
      pIVar7 = ImVector<ImDrawCmd>::operator[]
                         (&_col_local->CmdBuffer,(_col_local->CmdBuffer).Size + -1);
      pIVar7->ElemCount = pIVar7->ElemCount - iVar3;
      _col_local->_VtxWritePtr = (ImDrawVert *)idx_write;
      _col_local->_IdxWritePtr = pIStack_98;
      _col_local->_VtxCurrentIdx = c;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = (float)(int)pos.x + DisplayOffset.x;
    pos.y = (float)(int)pos.y + DisplayOffset.y;
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        float char_width = 0.0f;
        if (const ImFontGlyph* glyph = FindGlyph((ImWchar)c))
        {
            char_width = glyph->AdvanceX * scale;

            // Arbitrarily assume that both space and tabs are empty glyphs as an optimization
            if (c != ' ' && c != '\t')
            {
                // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
                float x1 = x + glyph->X0 * scale;
                float x2 = x + glyph->X1 * scale;
                float y1 = y + glyph->Y0 * scale;
                float y2 = y + glyph->Y1 * scale;
                if (x1 <= clip_rect.z && x2 >= clip_rect.x)
                {
                    // Render a character
                    float u1 = glyph->U0;
                    float v1 = glyph->V0;
                    float u2 = glyph->U1;
                    float v2 = glyph->V1;

                    // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                    if (cpu_fine_clip)
                    {
                        if (x1 < clip_rect.x)
                        {
                            u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                            x1 = clip_rect.x;
                        }
                        if (y1 < clip_rect.y)
                        {
                            v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                            y1 = clip_rect.y;
                        }
                        if (x2 > clip_rect.z)
                        {
                            u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                            x2 = clip_rect.z;
                        }
                        if (y2 > clip_rect.w)
                        {
                            v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                            y2 = clip_rect.w;
                        }
                        if (y1 >= y2)
                        {
                            x += char_width;
                            continue;
                        }
                    }

                    // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                    {
                        idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                        idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                        vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                        vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                        vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                        vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                        vtx_write += 4;
                        vtx_current_idx += 4;
                        idx_write += 6;
                    }
                }
            }
        }

        x += char_width;
    }

    // Give back unused vertices
    draw_list->VtxBuffer.resize((int)(vtx_write - draw_list->VtxBuffer.Data));
    draw_list->IdxBuffer.resize((int)(idx_write - draw_list->IdxBuffer.Data));
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size-1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}